

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v9::detail::utf8_decode(char *s,uint32_t *c,int *e)

{
  int iVar1;
  uint *in_RDX;
  uint *in_RSI;
  byte *in_RDI;
  char *next;
  int len;
  int shifte [5];
  int shiftc [5];
  uint32_t mins [5];
  int masks [5];
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 local_68;
  uint local_58 [8];
  uint local_38 [8];
  uint *local_18;
  uint *local_10;
  byte *local_8;
  
  local_38[0] = 0;
  local_38[1] = 0x7f;
  local_38[2] = 0x1f;
  local_38[3] = 0xf;
  local_38[4] = 7;
  local_58[0] = 0x400000;
  local_58[1] = 0;
  local_58[2] = 0x80;
  local_58[3] = 0x800;
  local_58[4] = 0x10000;
  local_78 = 0x1200000000;
  local_70 = 0x60000000c;
  local_68 = 0;
  local_98 = 0x600000000;
  local_90 = 0x200000004;
  local_88 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = code_point_length_impl(*in_RDI);
  *local_10 = ((uint)*local_8 & local_38[iVar1]) << 0x12;
  *local_10 = (local_8[1] & 0x3f) << 0xc | *local_10;
  *local_10 = (local_8[2] & 0x3f) << 6 | *local_10;
  *local_10 = local_8[3] & 0x3f | *local_10;
  *local_10 = *local_10 >> ((byte)*(undefined4 *)((long)&local_78 + (long)iVar1 * 4) & 0x1f);
  *local_18 = (uint)(*local_10 < local_58[iVar1]) << 6;
  *local_18 = (uint)(*local_10 >> 0xb == 0x1b) << 7 | *local_18;
  *local_18 = (uint)(0x10ffff < *local_10) << 8 | *local_18;
  *local_18 = (int)(local_8[1] & 0xc0) >> 2 | *local_18;
  *local_18 = (int)(local_8[2] & 0xc0) >> 4 | *local_18;
  *local_18 = (int)(uint)local_8[3] >> 6 | *local_18;
  *local_18 = *local_18 ^ 0x2a;
  *local_18 = (int)*local_18 >> ((byte)*(undefined4 *)((long)&local_98 + (long)iVar1 * 4) & 0x1f);
  return (char *)(local_8 + (long)(int)(uint)((iVar1 != 0 ^ 0xffU) & 1) + (long)iVar1);
}

Assistant:

FMT_CONSTEXPR inline auto utf8_decode(const char* s, uint32_t* c, int* e)
    -> const char* {
  constexpr const int masks[] = {0x00, 0x7f, 0x1f, 0x0f, 0x07};
  constexpr const uint32_t mins[] = {4194304, 0, 128, 2048, 65536};
  constexpr const int shiftc[] = {0, 18, 12, 6, 0};
  constexpr const int shifte[] = {0, 6, 4, 2, 0};

  int len = code_point_length_impl(*s);
  // Compute the pointer to the next character early so that the next
  // iteration can start working on the next character. Neither Clang
  // nor GCC figure out this reordering on their own.
  const char* next = s + len + !len;

  using uchar = unsigned char;

  // Assume a four-byte character and load four bytes. Unused bits are
  // shifted out.
  *c = uint32_t(uchar(s[0]) & masks[len]) << 18;
  *c |= uint32_t(uchar(s[1]) & 0x3f) << 12;
  *c |= uint32_t(uchar(s[2]) & 0x3f) << 6;
  *c |= uint32_t(uchar(s[3]) & 0x3f) << 0;
  *c >>= shiftc[len];

  // Accumulate the various error conditions.
  *e = (*c < mins[len]) << 6;       // non-canonical encoding
  *e |= ((*c >> 11) == 0x1b) << 7;  // surrogate half?
  *e |= (*c > 0x10FFFF) << 8;       // out of range?
  *e |= (uchar(s[1]) & 0xc0) >> 2;
  *e |= (uchar(s[2]) & 0xc0) >> 4;
  *e |= uchar(s[3]) >> 6;
  *e ^= 0x2a;  // top two bits of each tail byte correct?
  *e >>= shifte[len];

  return next;
}